

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v7::detail::fallback_format<long_double>
               (longdouble d,int num_digits,bool binary32,buffer<char> *buf,int *exp10)

{
  uint *puVar1;
  float fVar2;
  char *pcVar3;
  size_t sVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined7 in_register_00000031;
  bool bVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  bigint *lhs2;
  ulong uVar13;
  uint64_t value;
  bigint numerator;
  bigint denominator;
  bigint lower;
  bigint upper_store;
  bigint *local_340;
  bigint local_2f0;
  undefined1 local_240 [24];
  size_t local_228;
  uint local_220 [34];
  int local_198;
  undefined1 local_190 [16];
  ulong uStack_180;
  ulong local_178;
  uint local_170 [34];
  int local_e8;
  undefined1 local_e0 [16];
  ulong uStack_d0;
  ulong local_c8;
  uint local_c0 [34];
  int local_38;
  
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0014e4d0;
  puVar1 = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  iVar6 = 0;
  local_2f0.exp_ = 0;
  local_240._0_8_ = &PTR_grow_0014e4d0;
  local_240._16_8_ = 0;
  local_240._8_8_ = local_220;
  local_228 = 0x20;
  local_198 = 0;
  local_190._0_8_ = &PTR_grow_0014e4d0;
  uStack_180 = 0;
  local_190._8_8_ = local_170;
  local_178 = 0x20;
  local_e8 = 0;
  local_340 = (bigint *)local_e0;
  local_e0._0_8_ = &PTR_grow_0014e4d0;
  uStack_d0 = 0;
  local_e0._8_8_ = local_c0;
  local_c8 = 0x20;
  local_38 = 0;
  if ((int)CONCAT71(in_register_00000031,binary32) == 0) {
    uVar13 = 0;
    bVar9 = false;
  }
  else {
    fVar2 = (float)d;
    uVar8 = (uint)fVar2 & 0x7fffff;
    uVar13 = (ulong)uVar8 + 0x800000;
    if ((uint)fVar2 < 0x800000) {
      uVar13 = (ulong)uVar8;
    }
    iVar6 = -0x95;
    if ((uint)fVar2 >= 0x800000) {
      iVar6 = ((uint)fVar2 >> 0x17) - 0x96;
    }
    bVar9 = 0xffffff < (uint)fVar2 && uVar8 == 0;
  }
  iVar12 = bVar9 + 1;
  value = uVar13 << (sbyte)iVar12;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar1;
  if (iVar6 < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10(&local_2f0,-*exp10);
      sVar4 = local_2f0.bigits_.super_buffer<unsigned_int>.size_;
      if (local_178 < local_2f0.bigits_.super_buffer<unsigned_int>.size_) {
        (**(_func_int **)local_190._0_8_)
                  (local_190,local_2f0.bigits_.super_buffer<unsigned_int>.size_);
      }
      uStack_180 = local_178;
      if (sVar4 <= local_178) {
        uStack_180 = sVar4;
      }
      if (sVar4 != 0) {
        memmove((void *)local_190._8_8_,local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,sVar4 << 2
               );
      }
      sVar4 = local_2f0.bigits_.super_buffer<unsigned_int>.size_;
      local_e8 = local_2f0.exp_;
      if (bVar9 == false) {
        local_340 = (bigint *)0x0;
      }
      else {
        if (local_c8 < local_2f0.bigits_.super_buffer<unsigned_int>.size_) {
          (**(_func_int **)local_e0._0_8_)
                    (local_e0,local_2f0.bigits_.super_buffer<unsigned_int>.size_);
        }
        uStack_d0 = local_c8;
        if (sVar4 <= local_c8) {
          uStack_d0 = sVar4;
        }
        if (sVar4 != 0) {
          memmove((void *)local_e0._8_8_,local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,
                  sVar4 << 2);
        }
        local_340 = (bigint *)local_e0;
        local_38 = local_2f0.exp_;
        bigint::operator<<=(local_340,1);
      }
      bigint::multiply(&local_2f0,value);
      bigint::assign((bigint *)local_240,1);
      bigint::operator<<=((bigint *)local_240,iVar12 - iVar6);
    }
    else {
      bigint::assign(&local_2f0,value);
      bigint::assign_pow10((bigint *)local_240,*exp10);
      bigint::operator<<=((bigint *)local_240,iVar12 - iVar6);
      bigint::assign((bigint *)local_190,1);
      if (bVar9 == false) {
        local_340 = (bigint *)0x0;
      }
      else {
        bigint::assign((bigint *)local_e0,2);
      }
    }
  }
  else {
    bigint::assign(&local_2f0,value);
    bigint::operator<<=(&local_2f0,iVar6);
    bigint::assign((bigint *)local_190,1);
    bigint::operator<<=((bigint *)local_190,iVar6);
    if (bVar9 == false) {
      local_340 = (bigint *)0x0;
    }
    else {
      local_340 = (bigint *)local_e0;
      bigint::assign(local_340,1);
      bigint::operator<<=((bigint *)local_e0,iVar6 + 1);
    }
    bigint::assign_pow10((bigint *)local_240,*exp10);
    bigint::operator<<=((bigint *)local_240,iVar12);
  }
  if (-1 < num_digits) {
    *exp10 = *exp10 - (num_digits + -1);
    uVar8 = num_digits - 1;
    if (num_digits == 0) {
      if (buf->capacity_ == 0) {
        (**buf->_vptr_buffer)(buf,1);
      }
      buf->size_ = (ulong)(buf->capacity_ != 0);
      bigint::multiply((bigint *)local_240,10);
      iVar6 = add_compare(&local_2f0,&local_2f0,(bigint *)local_240);
      *buf->ptr_ = 0 < iVar6 | 0x30;
    }
    else {
      uVar13 = (ulong)(uint)num_digits;
      if (buf->capacity_ < uVar13) {
        (**buf->_vptr_buffer)(buf,uVar13);
      }
      uVar11 = buf->capacity_;
      if (uVar13 <= buf->capacity_) {
        uVar11 = uVar13;
      }
      buf->size_ = uVar11;
      if (1 < num_digits) {
        uVar11 = 0;
        do {
          iVar6 = bigint::divmod_assign(&local_2f0,(bigint *)local_240);
          buf->ptr_[uVar11] = (char)iVar6 + '0';
          bigint::multiply(&local_2f0,10);
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
      }
      uVar7 = bigint::divmod_assign(&local_2f0,(bigint *)local_240);
      iVar6 = add_compare(&local_2f0,&local_2f0,(bigint *)local_240);
      if ((0 < iVar6) || ((uVar7 & 1) != 0 && iVar6 == 0)) {
        if (uVar7 == 9) {
          buf->ptr_[(int)uVar8] = ':';
          if (1 < num_digits) {
            do {
              if (buf->ptr_[uVar13 - 1] != ':') break;
              buf->ptr_[uVar13 - 1] = '0';
              buf->ptr_[uVar13 - 2] = buf->ptr_[uVar13 - 2] + '\x01';
              uVar13 = uVar13 - 1;
            } while (1 < (long)uVar13);
          }
          if (*buf->ptr_ == ':') {
            *buf->ptr_ = '1';
            *exp10 = *exp10 + 1;
          }
          goto LAB_0011827a;
        }
        uVar7 = uVar7 + 1;
      }
      buf->ptr_[(int)uVar8] = (char)uVar7 + '0';
    }
    goto LAB_0011827a;
  }
  lhs2 = local_340;
  if (local_340 == (bigint *)0x0) {
    lhs2 = (bigint *)local_190;
  }
  pcVar3 = buf->ptr_;
  uVar8 = ~(uint)uVar13 & 1;
  lVar10 = 0;
  while( true ) {
    uVar7 = bigint::divmod_assign(&local_2f0,(bigint *)local_240);
    iVar6 = compare(&local_2f0,(bigint *)local_190);
    iVar12 = add_compare(&local_2f0,lhs2,(bigint *)local_240);
    pcVar3[lVar10] = (char)uVar7 + '0';
    if ((iVar6 < (int)uVar8) || ((int)-uVar8 < iVar12)) break;
    bigint::multiply(&local_2f0,10);
    bigint::multiply((bigint *)local_190,10);
    if (local_340 != (bigint *)0x0) {
      bigint::multiply(lhs2,10);
    }
    lVar10 = lVar10 + 1;
  }
  if (iVar6 < (int)uVar8) {
    if ((int)-uVar8 < iVar12) {
      iVar6 = add_compare(&local_2f0,&local_2f0,(bigint *)local_240);
      if ((0 < iVar6) || ((uVar7 & 1) != 0 && iVar6 == 0)) {
        cVar5 = pcVar3[lVar10] + '\x01';
        goto LAB_00118133;
      }
    }
  }
  else {
    cVar5 = (char)uVar7 + '1';
LAB_00118133:
    pcVar3[lVar10] = cVar5;
  }
  uVar13 = lVar10 + 1U & 0xffffffff;
  if (buf->capacity_ < uVar13) {
    (**buf->_vptr_buffer)(buf,uVar13);
  }
  if (buf->capacity_ < uVar13) {
    uVar13 = buf->capacity_;
  }
  buf->size_ = uVar13;
  *exp10 = *exp10 - (int)lVar10;
LAB_0011827a:
  if ((uint *)local_e0._8_8_ != local_c0) {
    operator_delete((void *)local_e0._8_8_,local_c8 << 2);
  }
  if ((uint *)local_190._8_8_ != local_170) {
    operator_delete((void *)local_190._8_8_,local_178 << 2);
  }
  if ((uint *)local_240._8_8_ != local_220) {
    operator_delete((void *)local_240._8_8_,local_228 << 2);
  }
  if (local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar1) {
    operator_delete(local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  return;
}

Assistant:

void fallback_format(Double d, int num_digits, bool binary32, buffer<char>& buf,
                     int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  const bool is_predecessor_closer =
      binary32 ? value.assign(static_cast<float>(d)) : value.assign(d);
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    buf.try_resize(1);
    denominator *= 10;
    buf[0] = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}